

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint update_adler32(uint adler,uchar *data,uint len)

{
  uint local_2c;
  uint local_28;
  uint local_24;
  uint amount;
  uint s2;
  uint s1;
  uint len_local;
  uchar *data_local;
  uint adler_local;
  
  amount = adler & 0xffff;
  local_24 = adler >> 0x10;
  s2 = len;
  _s1 = data;
  while (s2 != 0) {
    if (s2 < 0x15af) {
      local_2c = s2;
    }
    else {
      local_2c = 0x15ae;
    }
    s2 = s2 - local_2c;
    for (local_28 = local_2c; local_28 != 0; local_28 = local_28 - 1) {
      amount = *_s1 + amount;
      local_24 = amount + local_24;
      _s1 = _s1 + 1;
    }
    amount = amount % 0xfff1;
    local_24 = local_24 % 0xfff1;
  }
  return local_24 << 0x10 | amount;
}

Assistant:

static unsigned update_adler32(unsigned adler, const unsigned char* data, unsigned len)
{
   unsigned s1 = adler & 0xffff;
   unsigned s2 = (adler >> 16) & 0xffff;

  while(len > 0)
  {
    /*at least 5550 sums can be done before the sums overflow, saving a lot of module divisions*/
    unsigned amount = len > 5550 ? 5550 : len;
    len -= amount;
    while(amount > 0)
    {
      s1 += (*data++);
      s2 += s1;
      --amount;
    }
    s1 %= 65521;
    s2 %= 65521;
  }

  return (s2 << 16) | s1;
}